

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileTest.cpp
# Opt level: O3

void CompiledMixedType<long,unsigned_char>(void)

{
  uint64_t tmp_5;
  bool bVar1;
  int64_t tmp;
  int64_t t1;
  int64_t tmp_1;
  int64_t local_38;
  int64_t local_30;
  int64_t local_28;
  
  local_30 = 0;
  local_38 = 0;
  LargeIntRegMultiply<long,_unsigned_int>::
  RegMultiplyThrow<safeint_exception_handlers::SafeInt_InvalidParameter>(&local_30,0,&local_38);
  local_30 = 0;
  local_38 = 0;
  local_28 = 0;
  LargeIntRegMultiply<long,_long>::
  RegMultiplyThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
            (&local_30,&local_38,&local_28);
  local_30 = 0;
  local_38 = 0;
  LargeIntRegMultiply<long,_unsigned_int>::
  RegMultiplyThrow<safeint_exception_handlers::SafeInt_InvalidParameter>(&local_30,0,&local_38);
  local_30 = 0;
  local_38 = 0;
  LargeIntRegMultiply<long,_unsigned_int>::
  RegMultiplyThrow<safeint_exception_handlers::SafeInt_InvalidParameter>(&local_30,0,&local_38);
  local_30 = local_38;
  local_38 = 0;
  LargeIntRegMultiply<long,_unsigned_int>::
  RegMultiplyThrow<safeint_exception_handlers::SafeInt_InvalidParameter>(&local_30,0,&local_38);
  local_28 = 1;
  local_30 = 0;
  local_38 = 1;
  DivisionHelper<long,_long,_5>::DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
            (&local_28,&local_38,&local_30);
  if (local_28 != 0x7fffffffffffffff) {
    if (local_28 == 0) {
      safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnDivZero();
    }
    local_30 = 0;
    local_38 = 1;
    AdditionHelper<long,_long,_10>::
    AdditionThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
              (&local_28,&local_38,&local_30);
    if ((local_28 != 0x7fffffffffffffff) &&
       (bVar1 = local_28 != 0x7ffffffffffffffe, local_28 = local_28 + 1, bVar1)) {
      return;
    }
  }
  safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
}

Assistant:

void CompiledMixedType()
{
	// Mixed constructors
	U u = 0;
	T t = 0;
	bool b = false;
	SafeInt<T> st(u);
	SafeInt<U> su(u);
	SafeInt<T> st2(su);

	// Shut up the compiler
	b = !b;

	// Assignment
	st = t;
	st = u;
	st = su;
	st = st2;

	// Casting
	U u2 = (U)st;

	// Multiplication
	t = st * u;
	t = st * st2;
	t = u * st;
	st *= u;
	st *= su;

	// Modulus, modulus assignment
	u = 1;
	st = 1;
	su = 1;
	// For some reason, this is annoying the VS17 link time code generation
//	t = u % st;

	t = st % u;
	st2 = 1;
	t = st % st2;
	st %= u;
	st %= su;

	// Division
	u = 1;
	st2 = 1;
	st = 1;
	t = st / u;
	t = st / st2;
	t = u / st;
	st /= u;
	st /= su;

	// Addition
	t = st + u;
	t = st + st2;
	t = u + st;
	st += u;
	st += su;

	// Subtraction
	st = 0;
	u = 0;
	st2 = 0;
	t = st - u;
	t = st - st2;
	t = u - st;
	st -= u;

	st = 1;
	su = 1;
	st -= su;

	// Shift operators
	u = 1;
	su = 1;
	// Left
	t = st << u;
	t = st << su;
	t = t << su;

	st <<= u;
	st <<= su;

	// Right
	t = st >> u;
	t = st >> su;
	t = t >> su;

	st >>= u;
	st >>= su;

	// Binary operations
	// And
	t = st & st2;
	t = st & u;
	t = t & su;

	st &= st2;
	st &= u;
	st &= su;

	// Or
	t = st | st2;
	t = st | u;
	t = t | su;

	st |= st2;
	st |= u;
	st |= su;

	// Xor
	t = st ^ st2;
	t = st ^ u;
	t = t ^ su;

	st ^= st2;
	st ^= u;
	st ^= su;

	// Comparisons
	// Less than
	b = st < su;
	b = st < u;
	b = u < st;
	b = st < su;

	// Less than or equal
	b = st <= su;
	b = st <= u;
	b = u <= st;
	b = st <= su;

	// Greater than
	b = st > su;
	b = st > u;
	b = u > st;
	b = st > su;

	// Greater than or equal
	b = st >= su;
	b = st >= u;
	b = u >= st;
	b = st >= su;

	// Equals
	b = st == su;
	b = st == u;
	b = u == st;
	b = st == su;
}